

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_queue.hpp
# Opt level: O1

unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
__thiscall
pstore::broker::
message_queue<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>
::pop(message_queue<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>
      *this)

{
  long *plVar1;
  long in_RSI;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_30;
  
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  if (*(long *)(in_RSI + 0x88) == *(long *)(in_RSI + 0x68)) {
    do {
      std::condition_variable::wait((unique_lock *)(in_RSI + 0x28));
    } while (*(long *)(in_RSI + 0x88) == *(long *)(in_RSI + 0x68));
  }
  plVar1 = *(long **)(in_RSI + 0x68);
  (this->mut_).super___mutex_base._M_mutex.__align = *plVar1;
  *plVar1 = 0;
  std::
  deque<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>,_std::allocator<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>_>
  ::pop_front((deque<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>,_std::allocator<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>_>
               *)(in_RSI + 0x58));
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return (__uniq_ptr_data<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>,_true,_true>
          )(__uniq_ptr_data<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>,_true,_true>
            )this;
}

Assistant:

T message_queue<T>::pop () {
            std::unique_lock<decltype (mut_)> lock (mut_);
            cv.wait (lock, [this] () { return !queue_.empty (); });
            T res = std::move (queue_.front ());
            queue_.pop ();
            return res;
        }